

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O1

MPP_RET vcodec_service_cmd_send(void *ctx)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  MPP_RET MVar4;
  char *pcVar5;
  MPP_RET *pMVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  void *reg_set;
  
  lVar10 = (long)*(int *)((long)ctx + 0x1c) * 0xa0;
  piVar9 = (int *)((long)ctx + lVar10 + 0x28);
  lVar2 = *(long *)((long)ctx + lVar10 + 0xb8);
  if (*(int *)((long)ctx + lVar10 + 0x30) != 0) {
    uVar3 = *(uint *)((long)ctx + lVar10 + 0x28);
    pcVar5 = strstr((char *)((long)ctx + 8),"mjpeg");
    if (pcVar5 == (char *)0x0) {
      uVar8 = 0;
      do {
        puVar1 = (uint *)(lVar2 + (ulong)*(uint *)((long)ctx + uVar8 * 8 + lVar10 + 0x34) * 4);
        *puVar1 = *puVar1 | *(int *)((long)ctx + uVar8 * 8 + lVar10 + 0x38) << 10;
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)((long)ctx + lVar10 + 0x30));
    }
    else {
      memcpy((void *)((ulong)uVar3 + lVar2),(void *)((long)ctx + lVar10 + 0x2c),0x88);
      *piVar9 = *piVar9 + 0x88;
      *(undefined4 *)((long)ctx + lVar10 + 0x2c) = 0x4c4a46;
    }
    *(undefined4 *)((long)ctx + lVar10 + 0x30) = 0;
  }
  uVar3 = ioctl(*(int *)((long)ctx + 0x10),0x40086c03);
  MVar4 = MPP_OK;
  if (uVar3 != 0) {
    pMVar6 = __errno_location();
    MVar4 = *pMVar6;
    pcVar5 = strerror(MVar4);
    _mpp_log_l(2,"vcodec_service","ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n",
               "vcodec_service_cmd_send",(ulong)uVar3,(ulong)(uint)MVar4,pcVar5);
    MVar4 = *pMVar6;
  }
  iVar7 = *(int *)((long)ctx + 0x1c) + 1;
  if (*(int *)((long)ctx + 0x14) <= iVar7) {
    iVar7 = 0;
  }
  *(int *)((long)ctx + 0x1c) = iVar7;
  *(undefined4 *)((long)ctx + 0x208) = 0;
  return MVar4;
}

Assistant:

MPP_RET vcodec_service_cmd_send(void *ctx)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *send_cfg = &p->regs[p->reg_send_idx];
    VcodecExtraInfo *extra = &send_cfg->extra_info;
    void *reg_set = send_cfg->reg_set;
    char *fmt = (char*)&p->fmt;

    update_extra_info(extra, fmt, send_cfg);

    MPP_RET ret = vcodec_service_ioctl(p->fd, VPU_IOC_SET_REG,
                                       reg_set, send_cfg->reg_size);
    if (ret) {
        mpp_err_f("ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    p->reg_send_idx++;
    if (p->reg_send_idx >= p->max_regs)
        p->reg_send_idx = 0;
    p->info_count = 0;

    return ret;
}